

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f * operator*(Matrix4f *x,Matrix4f *y)

{
  float fVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  int i;
  long lVar4;
  Matrix4f *product;
  float *in_RDI;
  float *pfVar5;
  int j;
  long lVar6;
  long lVar7;
  
  pfVar3 = in_RDI;
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  in_RDI[8] = 0.0;
  in_RDI[9] = 0.0;
  in_RDI[10] = 0.0;
  in_RDI[0xb] = 0.0;
  in_RDI[0xc] = 0.0;
  in_RDI[0xd] = 0.0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    pfVar5 = y->m_elements;
    do {
      fVar1 = x->m_elements[lVar4 + lVar6 * 4];
      lVar7 = 0;
      do {
        auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pfVar5 + lVar7)),ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)((long)in_RDI + lVar7)));
        *(int *)((long)in_RDI + lVar7) = auVar2._0_4_;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      pfVar5 = pfVar5 + 1;
    } while (lVar6 != 4);
    lVar4 = lVar4 + 1;
    in_RDI = in_RDI + 1;
  } while (lVar4 != 4);
  return (Matrix4f *)pfVar3;
}

Assistant:

Matrix4f operator * ( const Matrix4f& x, const Matrix4f& y )
{
	Matrix4f product; // zeroes

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			for( int k = 0; k < 4; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}